

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommand.h
# Opt level: O0

void __thiscall cmCommand::~cmCommand(cmCommand *this)

{
  code *pcVar1;
  cmCommand *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~cmCommand() = default;